

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

GLuint create_texture(void)

{
  int iVar1;
  GLuint GStack_1001c;
  undefined1 auStack_10018 [4];
  GLuint texture;
  char pixels [65536];
  int local_10;
  int local_c;
  int y;
  int x;
  
  glGenTextures(1,&GStack_1001c);
  glBindTexture(0xde1,GStack_1001c);
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
      iVar1 = rand();
      auStack_10018[local_10 * 0x100 + local_c] = (char)(iVar1 % 0x100);
    }
  }
  glTexImage2D(0xde1,0,0x1909,0x100,0x100,0,0x1909,0x1401,auStack_10018);
  glTexParameteri(0xde1,0x2801,0x2601);
  glTexParameteri(0xde1,0x2800,0x2601);
  return GStack_1001c;
}

Assistant:

static GLuint create_texture(void)
{
    int x, y;
    char pixels[256 * 256];
    GLuint texture;

    glGenTextures(1, &texture);
    glBindTexture(GL_TEXTURE_2D, texture);

    for (y = 0;  y < 256;  y++)
    {
        for (x = 0;  x < 256;  x++)
            pixels[y * 256 + x] = rand() % 256;
    }

    glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, 256, 256, 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, pixels);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    return texture;
}